

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::cpp::ClassName_abi_cxx11_
          (string *__return_storage_ptr__,cpp *this,Descriptor *descriptor)

{
  bool bVar1;
  Descriptor *descriptor_00;
  NameKind in_R9D;
  undefined1 auVar2 [16];
  string_view name;
  AlphaNum local_140;
  string_view local_110;
  AlphaNum local_100;
  AlphaNum local_d0;
  string local_90;
  AlphaNum local_70;
  undefined1 local_40 [8];
  string res;
  Descriptor *parent;
  Descriptor *descriptor_local;
  
  res.field_2._8_8_ = Descriptor::containing_type((Descriptor *)this);
  std::__cxx11::string::string((string *)local_40);
  if (res.field_2._8_8_ != 0) {
    ClassName_abi_cxx11_(&local_90,(cpp *)res.field_2._8_8_,descriptor_00);
    absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_70,&local_90);
    absl::lts_20250127::AlphaNum::AlphaNum(&local_d0,"_");
    absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_40,&local_70,&local_d0);
    std::__cxx11::string::~string((string *)&local_90);
  }
  local_110 = Descriptor::name((Descriptor *)this);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_100,local_110);
  absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_40,&local_100);
  bVar1 = IsMapEntryMessage((Descriptor *)this);
  if (bVar1) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_140,"_DoNotUse");
    absl::lts_20250127::StrAppend((Nonnull<std::string_*>)local_40,&local_140);
  }
  auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_40);
  name._M_len = auVar2._8_8_;
  name._M_str = (char *)0x0;
  ResolveKnownNameCollisions_abi_cxx11_(__return_storage_ptr__,auVar2._0_8_,name,kFile,in_R9D);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string ClassName(const Descriptor* descriptor) {
  const Descriptor* parent = descriptor->containing_type();
  std::string res;
  if (parent) absl::StrAppend(&res, ClassName(parent), "_");
  absl::StrAppend(&res, descriptor->name());
  if (IsMapEntryMessage(descriptor)) absl::StrAppend(&res, "_DoNotUse");
  // This is the mangled message name which always goes in file scope.
  return ResolveKnownNameCollisions(res, NameContext::kFile, NameKind::kType);
}